

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

int __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
::GetCachedSize(MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  undefined4 extraout_var_00;
  uint uVar6;
  
  uVar3 = this->_has_bits_[0];
  iVar4 = 0;
  iVar2 = 0;
  if ((uVar3 & 1) != 0) {
    iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])(this);
    uVar5 = *(ulong *)CONCAT44(extraout_var,iVar2) | 1;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar2 = ((int)lVar1 * 9 + 0x49U >> 6) + 1;
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 2) != 0) {
    iVar4 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])(this);
    uVar3 = *(uint *)(CONCAT44(extraout_var_00,iVar4) + 8);
    uVar6 = uVar3 | 1;
    iVar4 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    iVar4 = uVar3 + (iVar4 * 9 + 0x49U >> 6) + 1;
  }
  return iVar4 + iVar2;
}

Assistant:

int GetCachedSize() const {
    int size = 0;
    size += has_key()
        ? kTagSize + KeyTypeHandler::GetCachedSize(key())
        : 0;
    size += has_value()
        ? kTagSize + ValueTypeHandler::GetCachedSize(
            value())
        : 0;
    return size;
  }